

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O2

void __thiscall PrettyPrinter::visit(PrettyPrinter *this,BinaryExpr *node)

{
  Expr *pEVar1;
  ostream *poVar2;
  string local_40;
  
  std::operator<<((ostream *)&std::cout,"(");
  tokTypeToString_abi_cxx11_(&local_40,node->m_op);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_40);
  std::operator<<(poVar2," ");
  std::__cxx11::string::~string((string *)&local_40);
  pEVar1 = (node->m_left)._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
           super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl;
  (*(pEVar1->super_Stmt)._vptr_Stmt[2])(pEVar1,this);
  std::operator<<((ostream *)&std::cout," ");
  pEVar1 = (node->m_right)._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
           super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl;
  (*(pEVar1->super_Stmt)._vptr_Stmt[2])(pEVar1,this);
  std::operator<<((ostream *)&std::cout,")");
  return;
}

Assistant:

void PrettyPrinter::visit(AST::BinaryExpr *node) {
    std::cout << "(";
    std::cout << tokTypeToString(node->m_op) << " ";
    node->m_left->accept(this);
    std::cout << " ";
    node->m_right->accept(this);
    std::cout << ")";
}